

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryHeap.h
# Opt level: O0

void __thiscall
Liby::BinaryHeap<Liby::WeakTimerHolder>::percolate_down
          (BinaryHeap<Liby::WeakTimerHolder> *this,size_type_conflict hole)

{
  bool bVar1;
  reference pvVar2;
  reference pvVar3;
  undefined1 local_60 [8];
  WeakTimerHolder tmp;
  size_type_conflict child;
  size_type_conflict hole_local;
  BinaryHeap<Liby::WeakTimerHolder> *this_local;
  
  tmp.weakTimerPtr_.super___weak_ptr<Liby::Timer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
  _4_4_ = hole;
  pvVar2 = std::vector<Liby::WeakTimerHolder,_std::allocator<Liby::WeakTimerHolder>_>::operator[]
                     (&this->heap,(ulong)hole);
  WeakTimerHolder::WeakTimerHolder((WeakTimerHolder *)local_60,pvVar2);
  while (tmp.weakTimerPtr_.super___weak_ptr<Liby::Timer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
         _M_pi._4_4_ << 1 <= this->size_) {
    tmp.weakTimerPtr_.super___weak_ptr<Liby::Timer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
    _0_4_ = tmp.weakTimerPtr_.super___weak_ptr<Liby::Timer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi._4_4_ * 2;
    if ((size_type_conflict)
        tmp.weakTimerPtr_.super___weak_ptr<Liby::Timer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != this->size_) {
      pvVar2 = std::vector<Liby::WeakTimerHolder,_std::allocator<Liby::WeakTimerHolder>_>::
               operator[](&this->heap,
                          (ulong)((size_type_conflict)
                                  tmp.weakTimerPtr_.
                                  super___weak_ptr<Liby::Timer,_(__gnu_cxx::_Lock_policy)2>.
                                  _M_refcount._M_pi + 1));
      pvVar3 = std::vector<Liby::WeakTimerHolder,_std::allocator<Liby::WeakTimerHolder>_>::
               operator[](&this->heap,
                          (ulong)(size_type_conflict)
                                 tmp.weakTimerPtr_.
                                 super___weak_ptr<Liby::Timer,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_refcount._M_pi);
      bVar1 = operator<(pvVar2,pvVar3);
      if (bVar1) {
        tmp.weakTimerPtr_.super___weak_ptr<Liby::Timer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi._0_4_ = (size_type_conflict)
                      tmp.weakTimerPtr_.super___weak_ptr<Liby::Timer,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi + 1;
      }
    }
    pvVar2 = std::vector<Liby::WeakTimerHolder,_std::allocator<Liby::WeakTimerHolder>_>::operator[]
                       (&this->heap,
                        (ulong)(size_type_conflict)
                               tmp.weakTimerPtr_.
                               super___weak_ptr<Liby::Timer,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                               ._M_pi);
    bVar1 = operator<(pvVar2,(WeakTimerHolder *)local_60);
    if (!bVar1) break;
    pvVar2 = std::vector<Liby::WeakTimerHolder,_std::allocator<Liby::WeakTimerHolder>_>::operator[]
                       (&this->heap,
                        (ulong)(size_type_conflict)
                               tmp.weakTimerPtr_.
                               super___weak_ptr<Liby::Timer,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                               ._M_pi);
    pvVar3 = std::vector<Liby::WeakTimerHolder,_std::allocator<Liby::WeakTimerHolder>_>::operator[]
                       (&this->heap,
                        (ulong)tmp.weakTimerPtr_.
                               super___weak_ptr<Liby::Timer,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                               ._M_pi._4_4_);
    WeakTimerHolder::operator=(pvVar3,pvVar2);
    tmp.weakTimerPtr_.super___weak_ptr<Liby::Timer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
    _4_4_ = (size_type_conflict)
            tmp.weakTimerPtr_.super___weak_ptr<Liby::Timer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi;
  }
  pvVar2 = std::vector<Liby::WeakTimerHolder,_std::allocator<Liby::WeakTimerHolder>_>::operator[]
                     (&this->heap,
                      (ulong)tmp.weakTimerPtr_.
                             super___weak_ptr<Liby::Timer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                             _M_pi._4_4_);
  WeakTimerHolder::operator=(pvVar2,(WeakTimerHolder *)local_60);
  WeakTimerHolder::~WeakTimerHolder((WeakTimerHolder *)local_60);
  return;
}

Assistant:

void percolate_down(size_type hole) {
        size_type child;
        T tmp = heap[hole];

        for (; hole * 2 <= size_; hole = child) {
            child = hole * 2;
            if (child != size_ && heap[child + 1] < heap[child])
                child++;
            if (heap[child] < tmp) {
                heap[hole] = heap[child];
            } else {
                break;
            }
        }
        heap[hole] = tmp;
    }